

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnumVal.cpp
# Opt level: O3

int main(int argC,char **argV)

{
  char cVar1;
  DTDValidator *this;
  SAXParser *this_00;
  long lVar2;
  DTDElementDecl *pDVar3;
  wchar16 *pwVar4;
  char *pcVar5;
  size_t sVar6;
  long *plVar7;
  ulong uVar8;
  long *plVar9;
  int iVar10;
  uint uVar11;
  NameIdPoolEnumerator<xercesc_4_0::DTDElementDecl> elemEnum;
  StrX local_68;
  int local_5c;
  NameIdPoolEnumerator<xercesc_4_0::DTDElementDecl> local_58;
  SAXParser *local_38;
  
  uVar8 = 0;
  xercesc_4_0::XMLPlatformUtils::Initialize
            ((char *)&xercesc_4_0::XMLUni::fgXercescDefaultLocale,(char *)0x0,(PanicHandler *)0x0,
             (MemoryManager *)0x0);
  if (((argC < 2) || (argC != 2)) || (pcVar5 = argV[1], *pcVar5 == '-')) {
    usage();
    xercesc_4_0::XMLPlatformUtils::Terminate();
    iVar10 = 1;
  }
  else {
    this = (DTDValidator *)xercesc_4_0::XMemory::operator_new((XMemory *)0x30,uVar8);
    uVar8 = 0;
    xercesc_4_0::DTDValidator::DTDValidator(this,(XMLErrorReporter *)0x0);
    this_00 = (SAXParser *)xercesc_4_0::XMemory::operator_new((XMemory *)0x108,uVar8);
    xercesc_4_0::SAXParser::SAXParser
              (this_00,(XMLValidator *)this,xercesc_4_0::XMLPlatformUtils::fgMemoryManager,
               (XMLGrammarPool *)0x0);
    xercesc_4_0::SAXParser::setValidationScheme((ValSchemes)this_00);
    (**(code **)(*(long *)this_00 + 0x40))(this_00,pcVar5);
    local_5c = xercesc_4_0::SAXParser::getErrorCount();
    if (local_5c == 0) {
      local_38 = this_00;
      lVar2 = (**(code **)(*(long *)this + 0x50))(this);
      local_58.fMemoryManager = *(MemoryManager **)(lVar2 + 8);
      local_58.fToEnum = *(NameIdPool<xercesc_4_0::DTDElementDecl> **)(lVar2 + 0x10);
      local_58.super_XMLEnumerator<xercesc_4_0::DTDElementDecl>._vptr_XMLEnumerator =
           (_func_int **)&PTR__XMLEnumerator_00104cb8;
      uVar8 = *(ulong *)(local_58.fToEnum + 0x18);
      local_58.fCurIndex = (XMLSize_t)(uVar8 != 0);
      if (uVar8 < local_58.fCurIndex || uVar8 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"The validator has no elements to display\n",0x29);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        this_00 = local_38;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"\nELEMENTS:\n----------------------------\n",0x28);
        while ((this_00 = local_38, local_58.fCurIndex != 0 &&
               (local_58.fCurIndex <= *(ulong *)(local_58.fToEnum + 0x18)))) {
          pDVar3 = xercesc_4_0::NameIdPoolEnumerator<xercesc_4_0::DTDElementDecl>::nextElement
                             (&local_58);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  Name: ",8);
          pwVar4 = (wchar16 *)xercesc_4_0::QName::getRawName();
          pcVar5 = (char *)xercesc_4_0::XMLString::transcode
                                     (pwVar4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
          local_68.fLocalForm = pcVar5;
          if (pcVar5 == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x106058);
          }
          else {
            sVar6 = strlen(pcVar5);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,sVar6);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
          StrX::~StrX(&local_68);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"  Content Model: ",0x11);
          pwVar4 = (wchar16 *)(**(code **)(*(long *)pDVar3 + 0x68))(pDVar3);
          pcVar5 = (char *)xercesc_4_0::XMLString::transcode
                                     (pwVar4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
          local_68.fLocalForm = pcVar5;
          if (pcVar5 == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x106058);
          }
          else {
            sVar6 = strlen(pcVar5);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,sVar6);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
          StrX::~StrX(&local_68);
          cVar1 = (**(code **)(*(long *)pDVar3 + 0x38))(pDVar3);
          if (cVar1 != '\0') {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"  Attributes:\n",0xe);
            plVar7 = (long *)(**(code **)(*(long *)pDVar3 + 0x28))(pDVar3);
            uVar11 = 0;
            while( true ) {
              uVar8 = (**(code **)(*plVar7 + 0x50))(plVar7);
              if (uVar8 <= uVar11) break;
              plVar9 = (long *)(**(code **)(*plVar7 + 0x58))(plVar7,(ulong)uVar11);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"    Name:",9);
              pwVar4 = (wchar16 *)(**(code **)(*plVar9 + 0x28))(plVar9);
              pcVar5 = (char *)xercesc_4_0::XMLString::transcode
                                         (pwVar4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
              local_68.fLocalForm = pcVar5;
              if (pcVar5 == (char *)0x0) {
                std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x106058);
              }
              else {
                sVar6 = strlen(pcVar5);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,pcVar5,sVar6);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", Type: ",8)
              ;
              StrX::~StrX(&local_68);
              uVar8 = (ulong)*(uint *)((long)plVar9 + 0xc);
              if (uVar8 < 10) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,&DAT_00103390 + *(int *)(&DAT_00103390 + uVar8 * 4)
                           ,*(long *)(&DAT_001033b8 + uVar8 * 8));
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
              uVar11 = uVar11 + 1;
            }
          }
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
          std::ostream::put('X');
          std::ostream::flush();
        }
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nErrors occurred, no output available\n",0x26);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
      std::ostream::put('X');
      std::ostream::flush();
    }
    (**(code **)(*(long *)this_00 + 8))(this_00);
    xercesc_4_0::XMLPlatformUtils::Terminate();
    iVar10 = (uint)(0 < local_5c) << 2;
  }
  return iVar10;
}

Assistant:

int main(int argC, char* argV[])
{
    // Initialize the XML4C system
    try
    {
         XMLPlatformUtils::Initialize();
    }

    catch (const XMLException& toCatch)
    {
         std::cerr   << "Error during initialization! Message:\n"
                << StrX(toCatch.getMessage()) << std::endl;
         return 1;
    }

    // Check command line and extract arguments.
    if (argC < 2)
    {
        usage();
        XMLPlatformUtils::Terminate();
        return 1;
    }

    // We only have one required parameter, which is the file to process
    if ((argC != 2) || (*(argV[1]) == '-'))
    {
        usage();
        XMLPlatformUtils::Terminate();
        return 1;
    }

    const char*              xmlFile   = argV[1];
    SAXParser::ValSchemes    valScheme = SAXParser::Val_Auto;

    //
    //  Create a DTD validator to be used for our validation work. Then create
    //  a SAX parser object and pass it our validator. Then, according to what
    //  we were told on the command line, set it to validate or not. He owns
    //  the validator, so we have to allocate it.
    //
    int errorCount = 0;
    DTDValidator* valToUse = new DTDValidator;
    SAXParser* parser = new SAXParser(valToUse);
    parser->setValidationScheme(valScheme);

    //
    //  Get the starting time and kick off the parse of the indicated
    //  file. Catch any exceptions that might propogate out of it.
    //
    int errorCode = 0;
    try
    {
        parser->parse(xmlFile);
        errorCount = parser->getErrorCount();
    }
    catch (const OutOfMemoryException&)
    {
        std::cerr << "OutOfMemoryException" << std::endl;
        errorCode = 5;
    }
    catch (const XMLException& e)
    {
        std::cerr << "\nError during parsing: '" << xmlFile << "'\n"
             << "Exception message is:  \n"
             << StrX(e.getMessage()) << "\n" << std::endl;
        errorCode = 4;
    }
    if(errorCode) {
        XMLPlatformUtils::Terminate();
        return errorCode;
    }

    if (!errorCount) {
        //
        //  Now we will get an enumerator for the element pool from the validator
        //  and enumerate the elements, printing them as we go. For each element
        //  we get an enumerator for its attributes and print them also.
        //
        DTDGrammar* grammar = (DTDGrammar*) valToUse->getGrammar();
        NameIdPoolEnumerator<DTDElementDecl> elemEnum = grammar->getElemEnumerator();
        if (elemEnum.hasMoreElements())
        {
            std::cout << "\nELEMENTS:\n----------------------------\n";
            while(elemEnum.hasMoreElements())
            {
                const DTDElementDecl& curElem = elemEnum.nextElement();
                std::cout << "  Name: " << StrX(curElem.getFullName()) << "\n";

                std::cout << "  Content Model: "
                     << StrX(curElem.getFormattedContentModel())
                     << "\n";

                // Get an enumerator for this guy's attributes if any
                if (curElem.hasAttDefs())
                {
                    std::cout << "  Attributes:\n";
                    XMLAttDefList& attList = curElem.getAttDefList();
                    for (unsigned int i=0; i<attList.getAttDefCount(); i++)
                    {
                        const XMLAttDef& curAttDef = attList.getAttDef(i);
                        std::cout << "    Name:" << StrX(curAttDef.getFullName())
                             << ", Type: ";

                        // Get the type and display it
                        const XMLAttDef::AttTypes type = curAttDef.getType();
                        switch(type)
                        {
                            case XMLAttDef::CData :
                                std::cout << "CDATA";
                                break;

                            case XMLAttDef::ID :
                                std::cout << "ID";
                                break;

                            case XMLAttDef::IDRef :
                            case XMLAttDef::IDRefs :
                                std::cout << "IDREF(S)";
                                break;

                            case XMLAttDef::Entity :
                            case XMLAttDef::Entities :
                                std::cout << "ENTITY(IES)";
                                break;

                            case XMLAttDef::NmToken :
                            case XMLAttDef::NmTokens :
                                std::cout << "NMTOKEN(S)";
                                break;

                            case XMLAttDef::Notation :
                                std::cout << "NOTATION";
                                break;

                            case XMLAttDef::Enumeration :
                                std::cout << "ENUMERATION";
                                break;
                            default:
                                break;
                        }

                        std::cout << "\n";
                    }
                }
                std::cout << std::endl;
            }
        }
         else
        {
            std::cout << "The validator has no elements to display\n" << std::endl;
        }
    }
    else
        std::cout << "\nErrors occurred, no output available\n" << std::endl;

    //
    //  Delete the parser itself.  Must be done prior to calling Terminate, below.
    //
    delete parser;

    // And call the termination method
    XMLPlatformUtils::Terminate();

    if (errorCount > 0)
        return 4;
    else
        return 0;
}